

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_expr.cc
# Opt level: O2

void __thiscall
expr_handle_name_gen_Test::~expr_handle_name_gen_Test(expr_handle_name_gen_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(expr, handle_name_gen) {  // NOLINT
    Context c;
    auto &mod1 = c.generator("mod1");
    auto &mod2 = c.generator("mod2");
    mod1.add_child_generator("mod", mod2.shared_from_this());
    auto &var = mod2.var("var_", 1);
    EXPECT_EQ(var.handle_name(&mod2), "var_");
    EXPECT_EQ(var.handle_name(&mod1), "mod.var_");
}